

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

hash_table_t * hash_table_new(int32 size,int32 casearg)

{
  int iVar1;
  hash_table_t *phVar2;
  long lVar3;
  hash_entry_t *phVar4;
  int32 *piVar5;
  
  phVar2 = (hash_table_t *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/hash_table.c"
                          ,0xa3);
  piVar5 = prime;
  lVar3 = 0;
  do {
    if ((size >> 1) + size <= *piVar5) goto LAB_00118ff3;
    lVar3 = lVar3 + 1;
    piVar5 = piVar5 + 1;
  } while (lVar3 != 0x2d);
  err_msg(ERR_WARN,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/hash_table.c"
          ,0x97,"Very large hash table requested (%d entries)\n");
  lVar3 = 0x2c;
LAB_00118ff3:
  iVar1 = prime[lVar3];
  phVar2->size = iVar1;
  phVar2->nocase = (uint)(casearg == 1);
  phVar4 = (hash_entry_t *)
           __ckd_calloc__((long)iVar1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/hash_table.c"
                          ,0xa6);
  phVar2->table = phVar4;
  return phVar2;
}

Assistant:

hash_table_t *
hash_table_new(int32 size, int32 casearg)
{
    hash_table_t *h;

    h = (hash_table_t *) ckd_calloc(1, sizeof(hash_table_t));
    h->size = prime_size(size + (size >> 1));
    h->nocase = (casearg == HASH_CASE_NO);
    h->table = (hash_entry_t *) ckd_calloc(h->size, sizeof(hash_entry_t));
    /* The above calloc clears h->table[*].key and .next to NULL, i.e. an empty table */

    return h;
}